

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_array.c
# Opt level: O2

void * arrayobj_new(t_symbol *s,int argc,t_atom *argv)

{
  t_symbol *__s1;
  int iVar1;
  t_atom *extraout_RDX;
  t_atom *argv_00;
  t_symbol *ptVar2;
  
  argv_00 = argv;
  if ((argc != 0) && (argv->a_type == A_SYMBOL)) {
    __s1 = (t_symbol *)((argv->a_w).w_symbol)->s_name;
    if (((*(char *)&__s1->s_name != 'd') || (*(char *)((long)&__s1->s_name + 1) != '\0')) &&
       (iVar1 = strcmp((char *)__s1,"define"), argv_00 = extraout_RDX, iVar1 != 0)) {
      ptVar2 = __s1;
      iVar1 = strcmp((char *)__s1,"size");
      if (iVar1 == 0) {
        pd_maininstance.pd_newest = (t_pd *)array_size_new(ptVar2,argc + -1,argv + 1);
        return pd_maininstance.pd_newest;
      }
      ptVar2 = __s1;
      iVar1 = strcmp((char *)__s1,"sum");
      if (iVar1 == 0) {
        pd_maininstance.pd_newest = (t_pd *)array_sum_new(ptVar2,argc + -1,argv + 1);
        return pd_maininstance.pd_newest;
      }
      ptVar2 = __s1;
      iVar1 = strcmp((char *)__s1,"get");
      if (iVar1 == 0) {
        pd_maininstance.pd_newest = (t_pd *)array_get_new(ptVar2,argc + -1,argv + 1);
        return pd_maininstance.pd_newest;
      }
      ptVar2 = __s1;
      iVar1 = strcmp((char *)__s1,"set");
      if (iVar1 == 0) {
        pd_maininstance.pd_newest = (t_pd *)array_set_new(ptVar2,argc + -1,argv + 1);
        return pd_maininstance.pd_newest;
      }
      ptVar2 = __s1;
      iVar1 = strcmp((char *)__s1,"quantile");
      if (iVar1 == 0) {
        pd_maininstance.pd_newest = (t_pd *)array_quantile_new(ptVar2,argc + -1,argv + 1);
        return pd_maininstance.pd_newest;
      }
      ptVar2 = __s1;
      iVar1 = strcmp((char *)__s1,"random");
      if (iVar1 == 0) {
        pd_maininstance.pd_newest = (t_pd *)array_random_new(ptVar2,argc + -1,argv + 1);
        return pd_maininstance.pd_newest;
      }
      ptVar2 = __s1;
      iVar1 = strcmp((char *)__s1,"max");
      if (iVar1 == 0) {
        pd_maininstance.pd_newest = (t_pd *)array_max_new(ptVar2,argc + -1,argv + 1);
        return pd_maininstance.pd_newest;
      }
      ptVar2 = __s1;
      iVar1 = strcmp((char *)__s1,"min");
      if (iVar1 == 0) {
        pd_maininstance.pd_newest = (t_pd *)array_min_new(ptVar2,argc + -1,argv + 1);
        return pd_maininstance.pd_newest;
      }
      pd_error((void *)0x0,"array %s: unknown function",__s1);
      pd_maininstance.pd_newest = (t_pd *)0x0;
      return (void *)0x0;
    }
    argc = argc - 1;
    argv = argv + 1;
  }
  pd_maininstance.pd_newest =
       (t_pd *)array_define_new((t_symbol *)(ulong)(uint)argc,(int)argv,argv_00);
  return pd_maininstance.pd_newest;
}

Assistant:

static void *arrayobj_new(t_symbol *s, int argc, t_atom *argv)
{
    if (!argc || argv[0].a_type != A_SYMBOL)
        pd_this->pd_newest = array_define_new(s, argc, argv);
    else
    {
        const char *str = argv[0].a_w.w_symbol->s_name;
        if (!strcmp(str, "d") || !strcmp(str, "define"))
            pd_this->pd_newest = array_define_new(s, argc-1, argv+1);
        else if (!strcmp(str, "size"))
            pd_this->pd_newest = array_size_new(s, argc-1, argv+1);
        else if (!strcmp(str, "sum"))
            pd_this->pd_newest = array_sum_new(s, argc-1, argv+1);
        else if (!strcmp(str, "get"))
            pd_this->pd_newest = array_get_new(s, argc-1, argv+1);
        else if (!strcmp(str, "set"))
            pd_this->pd_newest = array_set_new(s, argc-1, argv+1);
        else if (!strcmp(str, "quantile"))
            pd_this->pd_newest = array_quantile_new(s, argc-1, argv+1);
        else if (!strcmp(str, "random"))
            pd_this->pd_newest = array_random_new(s, argc-1, argv+1);
        else if (!strcmp(str, "max"))
            pd_this->pd_newest = array_max_new(s, argc-1, argv+1);
        else if (!strcmp(str, "min"))
            pd_this->pd_newest = array_min_new(s, argc-1, argv+1);
        else
        {
            pd_error(0, "array %s: unknown function", str);
            pd_this->pd_newest = 0;
        }
    }
    return (pd_this->pd_newest);
}